

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalysis.cpp
# Opt level: O3

void __thiscall
luna::SemanticAnalysisVisitor::Visit
          (SemanticAnalysisVisitor *this,UnaryExpression *unary_exp,void *data)

{
  SyntaxTree *pSVar1;
  undefined4 uVar2;
  SemanticException *this_00;
  int iVar3;
  ExpVarData exp_var_data;
  undefined8 local_24;
  undefined1 local_1c;
  
  local_24 = 1;
  local_1c = 0;
  pSVar1 = (unary_exp->exp_)._M_t.
           super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t.
           super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
           super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  (*pSVar1->_vptr_SyntaxTree[2])(pSVar1,this,&local_24);
  if (local_24._4_4_ == 0) {
    iVar3 = (unary_exp->op_token_).token_;
  }
  else {
    iVar3 = (unary_exp->op_token_).token_;
    if (iVar3 == 0x23) {
      uVar2 = 3;
      if ((local_24._4_4_ & 0xfffffffd) != 4) {
        this_00 = (SemanticException *)__cxa_allocate_exception(0x20);
        SemanticException::SemanticException
                  (this_00,"operand is not table or string",&unary_exp->op_token_);
        goto LAB_00154274;
      }
      goto LAB_00154248;
    }
    if (iVar3 == 0x2d) {
      uVar2 = 3;
      if (local_24._4_4_ == 3) goto LAB_00154248;
      this_00 = (SemanticException *)__cxa_allocate_exception(0x20);
      SemanticException::SemanticException(this_00,"operand is not number",&unary_exp->op_token_);
LAB_00154274:
      __cxa_throw(this_00,&SemanticException::typeinfo,Exception::~Exception);
    }
  }
  uVar2 = 3;
  if ((iVar3 != 0x23) && (iVar3 != 0x2d)) {
    if (iVar3 != 0x10d) {
      __assert_fail("!\"unexpect unary operator\"",
                    "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/SemanticAnalysis.cpp"
                    ,0x247,
                    "virtual void luna::SemanticAnalysisVisitor::Visit(UnaryExpression *, void *)");
    }
    uVar2 = 2;
  }
LAB_00154248:
  *(undefined4 *)((long)data + 4) = uVar2;
  return;
}

Assistant:

void SemanticAnalysisVisitor::Visit(UnaryExpression *unary_exp, void *data)
    {
        // Unary expression is read semantic
        ExpVarData exp_var_data{ SemanticOp_Read };
        unary_exp->exp_->Accept(this, &exp_var_data);

        // Expression type
        if (exp_var_data.exp_type_ != ExpType_Unknown)
        {
            switch (unary_exp->op_token_.token_)
            {
                case '-':
                    if (exp_var_data.exp_type_ != ExpType_Number)
                        throw SemanticException("operand is not number",
                                                unary_exp->op_token_);
                    break;
                case '#':
                    if (exp_var_data.exp_type_ != ExpType_Table &&
                        exp_var_data.exp_type_ != ExpType_String)
                        throw SemanticException("operand is not table or string",
                                                unary_exp->op_token_);
                    break;
                default:
                    break;
            }
        }

        auto parent_exp_var_data = static_cast<ExpVarData *>(data);
        if (unary_exp->op_token_.token_ == '-' ||
            unary_exp->op_token_.token_ == '#')
            parent_exp_var_data->exp_type_ = ExpType_Number;
        else if (unary_exp->op_token_.token_ == Token_Not)
            parent_exp_var_data->exp_type_ = ExpType_Bool;
        else
            assert(!"unexpect unary operator");
    }